

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::KNearestNeighborsClassifier::ByteSizeLong(KNearestNeighborsClassifier *this)

{
  bool bVar1;
  ClassLabelsCase CVar2;
  DefaultClassLabelCase DVar3;
  WeightingSchemeCase WVar4;
  int iVar5;
  string *value;
  int64 value_00;
  size_t sVar6;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  KNearestNeighborsClassifier *this_local;
  
  sStack_18 = 0;
  bVar1 = has_nearestneighborsindex(this);
  if (bVar1) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::NearestNeighborsIndex>
                          (this->nearestneighborsindex_);
    sStack_18 = sStack_18 + 1;
  }
  bVar1 = has_numberofneighbors(this);
  if (bVar1) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Parameter>(this->numberofneighbors_);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  CVar2 = ClassLabels_case(this);
  if (CVar2 != CLASSLABELS_NOT_SET) {
    if (CVar2 == kStringClassLabels) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::StringVector>
                        ((this->ClassLabels_).stringclasslabels_);
      sStack_18 = sVar6 + 2 + sStack_18;
    }
    else if (CVar2 == kInt64ClassLabels) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                        ((this->ClassLabels_).int64classlabels_);
      sStack_18 = sVar6 + 2 + sStack_18;
    }
  }
  DVar3 = DefaultClassLabel_case(this);
  if (DVar3 != DEFAULTCLASSLABEL_NOT_SET) {
    if (DVar3 == kDefaultStringLabel) {
      value = defaultstringlabel_abi_cxx11_(this);
      sVar6 = google::protobuf::internal::WireFormatLite::StringSize(value);
      sStack_18 = sVar6 + 2 + sStack_18;
    }
    else if (DVar3 == kDefaultInt64Label) {
      value_00 = defaultint64label(this);
      sVar6 = google::protobuf::internal::WireFormatLite::Int64Size(value_00);
      sStack_18 = sVar6 + 2 + sStack_18;
    }
  }
  WVar4 = WeightingScheme_case(this);
  if (WVar4 != WEIGHTINGSCHEME_NOT_SET) {
    if (WVar4 == kUniformWeighting) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::UniformWeighting>
                        ((this->WeightingScheme_).uniformweighting_);
      sStack_18 = sVar6 + 2 + sStack_18;
    }
    else if (WVar4 == kInverseDistanceWeighting) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::InverseDistanceWeighting>
                        ((this->WeightingScheme_).inversedistanceweighting_);
      sStack_18 = sVar6 + 2 + sStack_18;
    }
  }
  iVar5 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar5;
  return sStack_18;
}

Assistant:

size_t KNearestNeighborsClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.KNearestNeighborsClassifier)
  size_t total_size = 0;

  // .CoreML.Specification.NearestNeighborsIndex nearestNeighborsIndex = 1;
  if (this->has_nearestneighborsindex()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->nearestneighborsindex_);
  }

  // .CoreML.Specification.Int64Parameter numberOfNeighbors = 3;
  if (this->has_numberofneighbors()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->numberofneighbors_);
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  switch (DefaultClassLabel_case()) {
    // string defaultStringLabel = 110;
    case kDefaultStringLabel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->defaultstringlabel());
      break;
    }
    // int64 defaultInt64Label = 111;
    case kDefaultInt64Label: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->defaultint64label());
      break;
    }
    case DEFAULTCLASSLABEL_NOT_SET: {
      break;
    }
  }
  switch (WeightingScheme_case()) {
    // .CoreML.Specification.UniformWeighting uniformWeighting = 200;
    case kUniformWeighting: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *WeightingScheme_.uniformweighting_);
      break;
    }
    // .CoreML.Specification.InverseDistanceWeighting inverseDistanceWeighting = 210;
    case kInverseDistanceWeighting: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *WeightingScheme_.inversedistanceweighting_);
      break;
    }
    case WEIGHTINGSCHEME_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}